

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

uint64_t __thiscall rcg::Buffer::getTimestamp(Buffer *this)

{
  uint64_t uVar1;
  void *stream;
  unsigned_long uVar2;
  
  if ((this->payload_type == 4) &&
     ((this->nodemap).super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0)) {
    uVar1 = getInteger(&this->nodemap,"ChunkTimestamp",(int64_t *)0x0,(int64_t *)0x0,true,false);
    return uVar1;
  }
  stream = Stream::getHandle(this->parent);
  uVar2 = anon_unknown_6::getBufferValue<unsigned_long>(&this->gentl,stream,this->buffer,3);
  return uVar2;
}

Assistant:

uint64_t Buffer::getTimestamp() const
{
  if (payload_type == PAYLOAD_TYPE_CHUNK_DATA && nodemap)
  {
    try
    {
      return getInteger(nodemap, "ChunkTimestamp", 0, 0, true);
    }
    catch (const std::exception &)
    {
      // ignore error and try getBufferValue()
    }
  }

  return getBufferValue<uint64_t>(gentl, parent->getHandle(), buffer,
                                  GenTL::BUFFER_INFO_TIMESTAMP);
}